

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  IMmu *pIVar4;
  uint uVar5;
  uint16_t x;
  int iVar6;
  undefined8 unaff_R14;
  ulong uVar7;
  bool bVar8;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view format_str_03;
  pointer local_2c8;
  size_type sStack_2c0;
  ulong local_2b0;
  string rom;
  Nes nes;
  ifstream fs;
  
  if (argc == 3) {
    n_e_s::nes::Nes::Nes(&nes);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rom,argv[1],(allocator<char> *)&fs);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fs,argv[2],(allocator<char> *)&local_2c8);
    uVar3 = std::__cxx11::stoi((string *)&fs,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&fs);
    std::ifstream::ifstream(&fs,(string *)&rom,_S_bin);
    n_e_s::nes::Nes::load_rom(&nes,(istream *)&fs);
    local_2c8 = rom._M_dataplus._M_p;
    sStack_2c0 = rom._M_string_length;
    format_str.size_ = 0x12;
    format_str.data_ = "Running rom: \"{}\"\n";
    args.field_1.values_ =
         (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_2c8;
    args.desc_ = 0xd;
    fmt::v8::vprint(format_str,args);
    local_2c8 = (pointer)(ulong)uVar3;
    format_str_00.size_ = 0xd;
    format_str_00.data_ = "Cycles: \"{}\"\n";
    args_00.field_1.values_ =
         (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_2c8;
    args_00.desc_ = 1;
    fmt::v8::vprint(format_str_00,args_00);
    uVar5 = 0;
    if (0 < (int)uVar3) {
      uVar5 = uVar3;
    }
    while (bVar8 = uVar5 != 0, uVar5 = uVar5 - 1, bVar8) {
      n_e_s::nes::Nes::execute(&nes);
    }
    uVar7 = CONCAT62((int6)((ulong)unaff_R14 >> 0x10),0x2000);
    for (local_2b0 = 0; (short)local_2b0 != 0x1e; local_2b0 = (ulong)((int)local_2b0 + 1)) {
      for (iVar6 = 0; (short)iVar6 != 0x20; iVar6 = iVar6 + 1) {
        pIVar4 = n_e_s::nes::Nes::ppu_mmu(&nes);
        uVar5 = (int)uVar7 + iVar6;
        uVar5 = (*pIVar4->_vptr_IMmu[3])
                          (pIVar4,(ulong)(ushort)uVar5,pIVar4->_vptr_IMmu,(ulong)uVar5);
        local_2c8 = (pointer)(ulong)(uVar5 & 0xff);
        format_str_01.size_ = 7;
        format_str_01.data_ = "{:02X},";
        args_01.field_1.values_ =
             (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_2c8;
        args_01.desc_ = 2;
        fmt::v8::vprint(format_str_01,args_01);
      }
      format_str_02.size_ = 1;
      format_str_02.data_ = "\n";
      auVar2._8_8_ = 0;
      auVar2._0_8_ = &local_2c8;
      fmt::v8::vprint(format_str_02,(format_args)(auVar2 << 0x40));
      uVar7 = (ulong)((int)uVar7 + 0x20);
    }
    std::ifstream::~ifstream(&fs);
    std::__cxx11::string::~string((string *)&rom);
    n_e_s::nes::Nes::~Nes(&nes);
    iVar6 = 0;
  }
  else {
    format_str_03.size_ = 0x2a;
    format_str_03.data_ = "Expected two argument; <rom.nes> <cycles>\n";
    auVar1._8_8_ = 0;
    auVar1._0_8_ = &nes;
    fmt::v8::vprint(_stderr,format_str_03,(format_args)(auVar1 << 0x40));
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int main(int argc, char **argv) try {
    if (argc != 3) {
        fmt::print(stderr, "Expected two argument; <rom.nes> <cycles>\n");
        return 1;
    }

    n_e_s::nes::Nes nes;
    const std::string rom = argv[1];
    const int cycles = std::stoi(argv[2]);
    std::ifstream fs(rom, std::ios::binary);
    nes.load_rom(fs);

    fmt::print("Running rom: \"{}\"\n", rom);
    fmt::print("Cycles: \"{}\"\n", cycles);

    for (int i = 0; i < cycles; ++i) {
        nes.execute();
    }
    print_nametable(nes);
} catch (const std::exception &e) {
    fmt::print(stderr, "Exception: {}\n", e.what());
    return 1;
}